

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_function_impl.h
# Opt level: O3

void __thiscall
dlib::any_function<void_(),_void,_0UL>::derived<dlib::impl::image_display_functor,_void_()>::
~derived(derived<dlib::impl::image_display_functor,_void_()> *this)

{
  pointer pcVar1;
  
  (this->super_base)._vptr_Tbase = (_func_int **)&PTR__derived_00316ff8;
  (*(code *)**(this->item).mfp.super_mfp_kernel_1_base_class<1UL>.mp_memory.data)();
  pcVar1 = (this->item).str._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->item).str.field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

DLIB_ANY_FUNCTION_DERIVED_BOILERPLATE

    virtual result_type evaluate (
    ) const { DLIB_ANY_FUNCTION_RETURN item(); }